

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

call_modifier<trompeloeil::call_matcher<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::tuple<float,_const_char_*>_>,_GenericOperation2Mock<int,_float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::trompeloeil_l_tag_type_trompeloeil_61,_trompeloeil::sequence_injector<trompeloeil::return_injector<int,_trompeloeil::matcher_info<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>_>
 __thiscall
trompeloeil::
call_modifier<trompeloeil::call_matcher<int(float,std::__cxx11::string_const&),std::tuple<float,char_const*>>,GenericOperation2Mock<int,float,std::__cxx11::string_const&>::trompeloeil_l_tag_type_trompeloeil_61,trompeloeil::return_injector<int,trompeloeil::matcher_info<int(float,std::__cxx11::string_const&)>>>
::in_sequence<std::pair<char_const*,trompeloeil::sequence&>,false>
          (call_modifier<trompeloeil::call_matcher<int(float,std::__cxx11::string_const&),std::tuple<float,char_const*>>,GenericOperation2Mock<int,float,std::__cxx11::string_const&>::trompeloeil_l_tag_type_trompeloeil_61,trompeloeil::return_injector<int,trompeloeil::matcher_info<int(float,std::__cxx11::string_const&)>>>
           *this,pair<const_char_*,_trompeloeil::sequence_&> *t)

{
  pair<const_char_*,_trompeloeil::sequence_&> *t_local;
  call_modifier<trompeloeil::call_matcher<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::tuple<float,_const_char_*>_>,_GenericOperation2Mock<int,_float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::trompeloeil_l_tag_type_trompeloeil_61,_trompeloeil::return_injector<int,_trompeloeil::matcher_info<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
  *this_local;
  
  call_matcher<int(float,std::__cxx11::string_const&),std::tuple<float,char_const*>>::
  set_sequence<std::pair<char_const*,trompeloeil::sequence&>>
            (*(call_matcher<int(float,std::__cxx11::string_const&),std::tuple<float,char_const*>> **
              )this,t);
  call_modifier<trompeloeil::call_matcher<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::tuple<float,_const_char_*>_>,_GenericOperation2Mock<int,_float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::trompeloeil_l_tag_type_trompeloeil_61,_trompeloeil::sequence_injector<trompeloeil::return_injector<int,_trompeloeil::matcher_info<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>_>
  ::call_modifier((call_modifier<trompeloeil::call_matcher<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::tuple<float,_const_char_*>_>,_GenericOperation2Mock<int,_float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::trompeloeil_l_tag_type_trompeloeil_61,_trompeloeil::sequence_injector<trompeloeil::return_injector<int,_trompeloeil::matcher_info<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>_>
                   *)&this_local,
                  *(call_matcher<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::tuple<float,_const_char_*>_>
                    **)this);
  return (call_modifier<trompeloeil::call_matcher<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::tuple<float,_const_char_*>_>,_GenericOperation2Mock<int,_float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::trompeloeil_l_tag_type_trompeloeil_61,_trompeloeil::sequence_injector<trompeloeil::return_injector<int,_trompeloeil::matcher_info<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>_>
          )(call_matcher<int_(float,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::tuple<float,_const_char_*>_>
            *)this_local;
}

Assistant:

call_modifier<Matcher, modifier_tag, sequence_injector<Parent>>
    in_sequence(
      T&& ... t)
    {
      static_assert(!b,
                    "Multiple IN_SEQUENCE does not make sense."
                    " You can list several sequence objects at once");

      static_assert(upper_call_limit > 0,
                    "IN_SEQUENCE for forbidden call does not make sense");

      matcher->set_sequence(std::forward<T>(t)...);
      return {matcher};
    }